

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O0

void __thiscall asio::detail::thread_group::join(thread_group *this)

{
  long *in_RDI;
  item *tmp;
  posix_thread *in_stack_ffffffffffffffe0;
  
  while (*in_RDI != 0) {
    posix_thread::join(in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffe0 = (posix_thread *)*in_RDI;
    *in_RDI = *(long *)(*in_RDI + 0x10);
    if (in_stack_ffffffffffffffe0 != (posix_thread *)0x0) {
      item::~item((item *)0x1971dc);
      operator_delete(in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void join()
  {
    while (first_)
    {
      first_->thread_.join();
      item* tmp = first_;
      first_ = first_->next_;
      delete tmp;
    }
  }